

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread.c
# Opt level: O1

int run_test_thread_stack_size_explicit(void)

{
  code **ppcVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  long lVar3;
  undefined8 extraout_RDX;
  undefined8 unaff_RBX;
  long *plVar4;
  code **ppcVar5;
  long *plVar6;
  int64_t eval_b;
  int64_t eval_a;
  uv_thread_t thread;
  uv_thread_options_t options;
  long lStack_78;
  code *pcStack_70;
  undefined8 uStack_60;
  code *apcStack_58 [2];
  undefined8 uStack_48;
  code *apcStack_40 [2];
  undefined8 local_30;
  long local_28;
  undefined1 local_20 [8];
  undefined4 local_18 [2];
  long local_10;
  
  local_18[0] = 1;
  local_10 = 0x100000;
  apcStack_40[0] = (code *)0x1d2b55;
  iVar2 = uv_thread_create_ex(local_20,local_18,thread_check_stack);
  local_28 = (long)iVar2;
  local_30 = 0;
  if (local_28 == 0) {
    apcStack_40[0] = (code *)0x1d2b7f;
    iVar2 = uv_thread_join(local_20);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 != 0) goto LAB_001d2e53;
    local_10 = 0x800000;
    apcStack_40[0] = (code *)0x1d2bc0;
    iVar2 = uv_thread_create_ex(local_20,local_18,thread_check_stack);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 != 0) goto LAB_001d2e62;
    apcStack_40[0] = (code *)0x1d2bea;
    iVar2 = uv_thread_join(local_20);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 != 0) goto LAB_001d2e71;
    unaff_RBX = 0;
    local_10 = 0;
    apcStack_40[0] = (code *)0x1d2c29;
    iVar2 = uv_thread_create_ex(local_20,local_18,thread_check_stack);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 != 0) goto LAB_001d2e80;
    apcStack_40[0] = (code *)0x1d2c4f;
    iVar2 = uv_thread_join(local_20);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 != 0) goto LAB_001d2e8f;
    local_10 = 0x2a;
    apcStack_40[0] = (code *)0x1d2c90;
    iVar2 = uv_thread_create_ex(local_20,local_18,thread_check_stack);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 != 0) goto LAB_001d2e9e;
    apcStack_40[0] = (code *)0x1d2cba;
    iVar2 = uv_thread_join(local_20);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 != 0) goto LAB_001d2ead;
    apcStack_40[0] = (code *)0x1d2ce4;
    local_10 = __sysconf(0x4b);
    local_10 = local_10 + -0x2a;
    apcStack_40[0] = (code *)0x1d2d05;
    iVar2 = uv_thread_create_ex(local_20,local_18,thread_check_stack);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 != 0) goto LAB_001d2ebc;
    apcStack_40[0] = (code *)0x1d2d2f;
    iVar2 = uv_thread_join(local_20);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 != 0) goto LAB_001d2ecb;
    apcStack_40[0] = (code *)0x1d2d59;
    lVar3 = __sysconf(0x4b);
    local_10 = lVar3 / 2 + -0x2a;
    apcStack_40[0] = (code *)0x1d2d87;
    iVar2 = uv_thread_create_ex(local_20,local_18,thread_check_stack);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 != 0) goto LAB_001d2eda;
    apcStack_40[0] = (code *)0x1d2db1;
    iVar2 = uv_thread_join(local_20);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 != 0) goto LAB_001d2ee9;
    local_10 = 0x12d687;
    apcStack_40[0] = (code *)0x1d2df2;
    iVar2 = uv_thread_create_ex(local_20,local_18,thread_check_stack);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 == 0) {
      apcStack_40[0] = (code *)0x1d2e1c;
      iVar2 = uv_thread_join(local_20);
      local_28 = (long)iVar2;
      local_30 = 0;
      if (local_28 == 0) {
        return 0;
      }
      goto LAB_001d2f07;
    }
  }
  else {
    apcStack_40[0] = (code *)0x1d2e53;
    run_test_thread_stack_size_explicit_cold_1();
LAB_001d2e53:
    apcStack_40[0] = (code *)0x1d2e62;
    run_test_thread_stack_size_explicit_cold_2();
LAB_001d2e62:
    apcStack_40[0] = (code *)0x1d2e71;
    run_test_thread_stack_size_explicit_cold_3();
LAB_001d2e71:
    apcStack_40[0] = (code *)0x1d2e80;
    run_test_thread_stack_size_explicit_cold_4();
LAB_001d2e80:
    apcStack_40[0] = (code *)0x1d2e8f;
    run_test_thread_stack_size_explicit_cold_5();
LAB_001d2e8f:
    apcStack_40[0] = (code *)0x1d2e9e;
    run_test_thread_stack_size_explicit_cold_6();
LAB_001d2e9e:
    apcStack_40[0] = (code *)0x1d2ead;
    run_test_thread_stack_size_explicit_cold_7();
LAB_001d2ead:
    apcStack_40[0] = (code *)0x1d2ebc;
    run_test_thread_stack_size_explicit_cold_8();
LAB_001d2ebc:
    apcStack_40[0] = (code *)0x1d2ecb;
    run_test_thread_stack_size_explicit_cold_9();
LAB_001d2ecb:
    apcStack_40[0] = (code *)0x1d2eda;
    run_test_thread_stack_size_explicit_cold_10();
LAB_001d2eda:
    apcStack_40[0] = (code *)0x1d2ee9;
    run_test_thread_stack_size_explicit_cold_11();
LAB_001d2ee9:
    apcStack_40[0] = (code *)0x1d2ef8;
    run_test_thread_stack_size_explicit_cold_12();
  }
  apcStack_40[0] = (code *)0x1d2f07;
  run_test_thread_stack_size_explicit_cold_13();
LAB_001d2f07:
  plVar4 = &local_28;
  apcStack_40[0] = getaddrinfo_do;
  run_test_thread_stack_size_explicit_cold_14();
  apcStack_58[0] = (code *)0x1d2f3e;
  iVar2 = uv_getaddrinfo(plVar4[2],plVar4 + 3,getaddrinfo_cb,"localhost",0,0);
  apcStack_40[0] = (code *)(long)iVar2;
  uStack_48 = 0;
  if (apcStack_40[0] == (code *)0x0) {
    return iVar2;
  }
  ppcVar5 = apcStack_40;
  apcStack_58[0] = fs_do;
  getaddrinfo_do_cold_1();
  pcStack_70 = (code *)0x1d2f90;
  iVar2 = uv_fs_stat(ppcVar5[2],ppcVar5 + 3,".",fs_cb);
  apcStack_58[0] = (code *)(long)iVar2;
  uStack_60 = 0;
  if (apcStack_58[0] == (code *)0x0) {
    return iVar2;
  }
  ppcVar5 = apcStack_58;
  iVar2 = (int)&uStack_60;
  pcStack_70 = getaddrinfo_cb;
  fs_do_cold_1();
  lStack_78 = (long)iVar2;
  pcStack_70 = (code *)unaff_RBX;
  if (lStack_78 != 0) {
    plVar6 = &lStack_78;
    getaddrinfo_cb_cold_1();
    iVar2 = uv_fs_req_cleanup();
    plVar4 = plVar6 + -2;
    *(int *)plVar4 = (int)*plVar4 + -1;
    if ((int)*plVar4 != 0) {
      fs_do((fs_req *)(plVar6 + -3));
      return extraout_EAX_00;
    }
    return iVar2;
  }
  iVar2 = uv_freeaddrinfo(extraout_RDX);
  ppcVar1 = ppcVar5 + -2;
  *(int *)ppcVar1 = *(int *)ppcVar1 + -1;
  if (*(int *)ppcVar1 != 0) {
    getaddrinfo_do((getaddrinfo_req *)(ppcVar5 + -3));
    return extraout_EAX;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(thread_stack_size_explicit) {
  uv_thread_t thread;
  uv_thread_options_t options;

  options.flags = UV_THREAD_HAS_STACK_SIZE;
  options.stack_size = 1024 * 1024;
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

  options.stack_size = 8 * 1024 * 1024;  /* larger than most default os sizes */
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

  options.stack_size = 0;
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

  options.stack_size = 42;
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

#ifdef PTHREAD_STACK_MIN
  options.stack_size = PTHREAD_STACK_MIN - 42;  /* unaligned size */
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

  options.stack_size = PTHREAD_STACK_MIN / 2 - 42;  /* unaligned size */
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));
#endif

  /* unaligned size, should be larger than PTHREAD_STACK_MIN */
  options.stack_size = 1234567;
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

  return 0;
}